

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFromBinaryWithSize(uchar *value,size_t size)

{
  ulong in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  SimpleString SVar2;
  ulong local_68;
  SimpleString local_40;
  ulong local_30;
  size_t displayedSize;
  ulong local_20;
  size_t size_local;
  uchar *value_local;
  SimpleString *result;
  
  displayedSize._7_1_ = 0;
  local_20 = in_RDX;
  size_local = size;
  value_local = value;
  StringFromFormat((char *)value,"Size = %u | HexContents = ",in_RDX & 0xffffffff);
  if (local_20 < 0x81) {
    local_68 = local_20;
  }
  else {
    local_68 = 0x80;
  }
  local_30 = local_68;
  StringFromBinaryOrNull((uchar *)&local_40,size_local);
  SimpleString::operator+=((SimpleString *)value,&local_40);
  SimpleString::~SimpleString(&local_40);
  sVar1 = extraout_RDX;
  if (local_30 < local_20) {
    SimpleString::operator+=((SimpleString *)value," ...");
    sVar1 = extraout_RDX_00;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)value;
  return SVar2;
}

Assistant:

SimpleString StringFromBinaryWithSize(const unsigned char* value, size_t size)
{
    SimpleString result = StringFromFormat("Size = %u | HexContents = ", (unsigned) size);
    size_t displayedSize = ((size > 128) ? 128 : size);
    result += StringFromBinaryOrNull(value, displayedSize);
    if (size > displayedSize)
    {
        result += " ...";
    }
    return result;
}